

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O1

void __thiscall
Buffer_change_event_remove_buffer_Test::TestBody(Buffer_change_event_remove_buffer_Test *this)

{
  void *pvVar1;
  unsigned_long uVar2;
  size_t sVar3;
  char *pcVar4;
  initializer_list<bfy_changed_cb_info> __l;
  AssertionResult gtest_ar_1;
  size_t i;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  BufferWithReadonlyStrings tgt;
  BufferWithReadonlyStrings local;
  undefined1 local_2c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  pointer local_2b0;
  allocator_type local_2a1;
  unsigned_long local_2a0;
  internal local_298 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  bfy_changed_cb_info local_288;
  undefined1 local_270 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> local_1c8;
  BufferWithReadonlyStrings local_1b0;
  BufferWithReadonlyStrings local_f0;
  
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_f0);
  local_2c0._0_4_ = 1;
  local_1b0.buf.page.data =
       (int8_t *)bfy_buffer_peek(&local_f0.buf,0xffffffffffffffff,(bfy_iovec *)0x0,0);
  testing::internal::CmpHelperLT<int,unsigned_long>
            ((internal *)local_270,"1","buffer_count_pages(&local.buf)",(int *)local_2c0,
             (unsigned_long *)&local_1b0);
  if (local_270[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_268 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_268->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5ef,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2c0,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2c0);
    if ((long *)local_1b0.buf.page.data != (long *)0x0) {
      (**(code **)(*(long *)local_1b0.buf.page.data + 8))();
    }
  }
  if (local_268 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_268,local_268);
  }
  local_2a0 = 1;
  sVar3 = bfy_buffer_get_content_len(&local_f0.buf);
  if (local_2a0 < sVar3) {
    do {
      anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::BufferWithReadonlyStrings
                ((BufferWithReadonlyStrings *)local_270);
      uVar2 = local_2a0;
      bfy_buffer_set_changed_cb
                ((bfy_buffer *)local_270,
                 (anonymous_namespace)::BufferWithReadonlyStrings::start_listening_to_changes()::
                 {lambda(auto:1*,auto:2_const*,void*)#1}::__invoke<bfy_buffer,bfy_changed_cb_info>,
                 &local_1c8);
      anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_1b0);
      local_288.orig_size =
           bfy_buffer_remove_buffer((bfy_buffer *)local_270,local_2a0,&local_1b0.buf);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_2c0,"i","bfy_buffer_remove_buffer(&mabel.buf, i, &tgt.buf)",
                 &local_2a0,&local_288.orig_size);
      if (local_2c0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_288);
        pcVar4 = "";
        if (local_2b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = (local_2b8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_298,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
                   ,0x5fb,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)&local_288);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
        if ((long *)local_288.orig_size != (long *)0x0) {
          (**(code **)(*(long *)local_288.orig_size + 8))();
        }
      }
      if (local_2b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2b8,local_2b8);
      }
      local_288.n_added = 0;
      local_288.n_deleted = uVar2;
      __l._M_len = 1;
      __l._M_array = &local_288;
      local_288.orig_size = sVar3;
      std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
                ((vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)local_2c0,__l,
                 &local_2a1);
      testing::internal::
      CmpHelperEQ<std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>,std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>>
                (local_298,"changes_t{expected}","mabel.changes",
                 (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)local_2c0,
                 &local_1c8);
      pvVar1 = (void *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,(long)local_2b0 - (long)pvVar1);
      }
      if (local_298[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_2c0);
        pcVar4 = "";
        if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = (local_290->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_288,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
                   ,0x5fc,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)local_2c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
        if ((long *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_) + 8))();
        }
      }
      if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_290,local_290);
      }
      anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_1b0);
      anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
                ((BufferWithReadonlyStrings *)local_270);
      local_2a0 = local_2a0 + 1;
    } while (local_2a0 < sVar3);
  }
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_f0);
  return;
}

Assistant:

TEST(Buffer, change_event_remove_buffer) {
    BufferWithReadonlyStrings const local;
    // confirm this test exercises removing <1, ==1, and >1 pages
    EXPECT_LT(1, buffer_count_pages(&local.buf));

    for (size_t i=1, n=bfy_buffer_get_content_len(&local.buf); i < n; ++i) {
        BufferWithReadonlyStrings mabel;
        auto const expected = bfy_changed_cb_info {
            .orig_size = n,
            .n_added = 0,
            .n_deleted = i
        };

        mabel.start_listening_to_changes();
        BufferWithReadonlyStrings tgt;
        EXPECT_EQ(i, bfy_buffer_remove_buffer(&mabel.buf, i, &tgt.buf));
        EXPECT_EQ(changes_t{expected}, mabel.changes);
    }
}